

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings.cpp
# Opt level: O1

void __thiscall PDA::Utils::Settings::initParams(Settings *this,int argc,char **argv)

{
  wchar_t *pwVar1;
  size_type sVar2;
  int iVar3;
  InformationException *pIVar4;
  ParamsException *pPVar5;
  int iVar6;
  wstring currentParam;
  wchar_t buf [1025];
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_10b8;
  char **local_1098;
  wstring local_1090;
  wstring *local_1070;
  wstring *local_1068;
  wstring *local_1060;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_1058;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_1038 [128];
  
  local_1068 = &this->m_outputFilePath;
  this->m_advancedEnable = false;
  this->m_syntaxTraceEnable = false;
  this->m_isVersion = false;
  this->m_isHelp = false;
  local_1098 = argv;
  std::__cxx11::wstring::_M_replace
            ((ulong)local_1068,0,(wchar_t *)(this->m_outputFilePath)._M_string_length,0x13798c);
  if (1 < argc) {
    local_1070 = (wstring *)&this->m_includeFilePath;
    local_1060 = &this->m_sourceFilePath;
    iVar6 = 1;
    do {
      local_10b8._M_string_length = 0;
      local_10b8.field_2._M_local_buf[0] = L'\0';
      local_10b8._M_dataplus._M_p = (pointer)&local_10b8.field_2;
      mbstowcs((wchar_t *)local_1038,local_1098[iVar6],0x400);
      sVar2 = local_10b8._M_string_length;
      wcslen((wchar_t *)local_1038);
      std::__cxx11::wstring::_M_replace((ulong)&local_10b8,0,(wchar_t *)sVar2,(ulong)local_1038);
      sVar2 = local_10b8._M_string_length;
      if ((wchar_t *)local_10b8._M_string_length == _DAT_0014f428) {
        if ((wchar_t *)local_10b8._M_string_length != (wchar_t *)0x0) {
          iVar3 = wmemcmp(local_10b8._M_dataplus._M_p,Constants::helpArgumentLong_abi_cxx11_,
                          local_10b8._M_string_length);
          if (iVar3 != 0) goto LAB_0012a317;
        }
LAB_0012a58f:
        this->m_isHelp = true;
      }
      else {
LAB_0012a317:
        if ((wchar_t *)sVar2 == DAT_0014f448) {
          if ((wchar_t *)sVar2 != (wchar_t *)0x0) {
            iVar3 = wmemcmp(local_10b8._M_dataplus._M_p,Constants::helpArgumentShort_abi_cxx11_,
                            sVar2);
            if (iVar3 != 0) goto LAB_0012a344;
          }
          goto LAB_0012a58f;
        }
LAB_0012a344:
        if ((wchar_t *)sVar2 == DAT_0014f468) {
          if ((wchar_t *)sVar2 != (wchar_t *)0x0) {
            iVar3 = wmemcmp(local_10b8._M_dataplus._M_p,Constants::versionArgumentLong_abi_cxx11_,
                            sVar2);
            if (iVar3 != 0) goto LAB_0012a371;
          }
LAB_0012a59b:
          this->m_isVersion = true;
        }
        else {
LAB_0012a371:
          if ((wchar_t *)sVar2 == DAT_0014f488) {
            if ((wchar_t *)sVar2 != (wchar_t *)0x0) {
              iVar3 = wmemcmp(local_10b8._M_dataplus._M_p,Constants::versionArgumentShort_abi_cxx11_
                              ,sVar2);
              if (iVar3 != 0) goto LAB_0012a39e;
            }
            goto LAB_0012a59b;
          }
LAB_0012a39e:
          if ((wchar_t *)sVar2 == DAT_0014f4a8) {
            if ((wchar_t *)sVar2 != (wchar_t *)0x0) {
              iVar3 = wmemcmp(local_10b8._M_dataplus._M_p,
                              Constants::sourceFilePathArgumentLong_abi_cxx11_,sVar2);
              if (iVar3 != 0) goto LAB_0012a3cb;
            }
LAB_0012a5a7:
            iVar6 = iVar6 + 1;
            if (argc <= iVar6) {
              pPVar5 = (ParamsException *)__cxa_allocate_exception(0x28);
              local_1090._M_dataplus._M_p = (pointer)&local_1090.field_2;
              std::__cxx11::wstring::_M_construct<wchar_t_const*>
                        ((wstring *)&local_1090,L"Key -S (--source) used but without argument",L"");
              Exception::ParamsException::ParamsException(pPVar5,&local_1090);
              __cxa_throw(pPVar5,&Exception::ParamsException::typeinfo,
                          Exception::Exception::~Exception);
            }
            mbstowcs((wchar_t *)local_1038,local_1098[iVar6],0x400);
            pwVar1 = (wchar_t *)(this->m_sourceFilePath)._M_string_length;
            wcslen((wchar_t *)local_1038);
            std::__cxx11::wstring::_M_replace((ulong)local_1060,0,pwVar1,(ulong)local_1038);
          }
          else {
LAB_0012a3cb:
            if ((wchar_t *)sVar2 == DAT_0014f4c8) {
              if ((wchar_t *)sVar2 != (wchar_t *)0x0) {
                iVar3 = wmemcmp(local_10b8._M_dataplus._M_p,
                                Constants::sourceFilePathArgumentShort_abi_cxx11_,sVar2);
                if (iVar3 != 0) goto LAB_0012a3f8;
              }
              goto LAB_0012a5a7;
            }
LAB_0012a3f8:
            if ((wchar_t *)sVar2 == DAT_0014f5c8) {
              if ((wchar_t *)sVar2 != (wchar_t *)0x0) {
                iVar3 = wmemcmp(local_10b8._M_dataplus._M_p,Constants::traceArgumentShort_abi_cxx11_
                                ,sVar2);
                if (iVar3 != 0) goto LAB_0012a425;
              }
LAB_0012a5ef:
              this->m_syntaxTraceEnable = true;
            }
            else {
LAB_0012a425:
              if ((wchar_t *)sVar2 == DAT_0014f5a8) {
                if ((wchar_t *)sVar2 != (wchar_t *)0x0) {
                  iVar3 = wmemcmp(local_10b8._M_dataplus._M_p,
                                  Constants::traceArgumentLong_abi_cxx11_,sVar2);
                  if (iVar3 != 0) goto LAB_0012a452;
                }
                goto LAB_0012a5ef;
              }
LAB_0012a452:
              if ((wchar_t *)sVar2 == DAT_0014f5e8) {
                if ((wchar_t *)sVar2 != (wchar_t *)0x0) {
                  iVar3 = wmemcmp(local_10b8._M_dataplus._M_p,Constants::advancedLogLong_abi_cxx11_,
                                  sVar2);
                  if (iVar3 != 0) goto LAB_0012a47f;
                }
LAB_0012a5f8:
                this->m_advancedEnable = true;
              }
              else {
LAB_0012a47f:
                if ((wchar_t *)sVar2 == DAT_0014f608) {
                  if ((wchar_t *)sVar2 != (wchar_t *)0x0) {
                    iVar3 = wmemcmp(local_10b8._M_dataplus._M_p,
                                    Constants::advancedLogShort_abi_cxx11_,sVar2);
                    if (iVar3 != 0) goto LAB_0012a4ac;
                  }
                  goto LAB_0012a5f8;
                }
LAB_0012a4ac:
                if ((wchar_t *)sVar2 == DAT_0014f568) {
                  if ((wchar_t *)sVar2 != (wchar_t *)0x0) {
                    iVar3 = wmemcmp(local_10b8._M_dataplus._M_p,
                                    Constants::outputPathArgumentLong_abi_cxx11_,sVar2);
                    if (iVar3 != 0) goto LAB_0012a4d9;
                  }
LAB_0012a601:
                  iVar6 = iVar6 + 1;
                  if (argc <= iVar6) {
                    pPVar5 = (ParamsException *)__cxa_allocate_exception(0x28);
                    local_1090._M_dataplus._M_p = (pointer)&local_1090.field_2;
                    std::__cxx11::wstring::_M_construct<wchar_t_const*>
                              ((wstring *)&local_1090,L"Key -O (--output) used but without argument"
                               ,L"");
                    Exception::ParamsException::ParamsException(pPVar5,&local_1090);
                    __cxa_throw(pPVar5,&Exception::ParamsException::typeinfo,
                                Exception::Exception::~Exception);
                  }
                  mbstowcs((wchar_t *)local_1038,local_1098[iVar6],0x400);
                  pwVar1 = (wchar_t *)(this->m_outputFilePath)._M_string_length;
                  wcslen((wchar_t *)local_1038);
                  std::__cxx11::wstring::_M_replace((ulong)local_1068,0,pwVar1,(ulong)local_1038);
                }
                else {
LAB_0012a4d9:
                  if ((wchar_t *)sVar2 == DAT_0014f588) {
                    if ((wchar_t *)sVar2 != (wchar_t *)0x0) {
                      iVar3 = wmemcmp(local_10b8._M_dataplus._M_p,
                                      Constants::outputPathArgumentShort_abi_cxx11_,sVar2);
                      if (iVar3 != 0) goto LAB_0012a506;
                    }
                    goto LAB_0012a601;
                  }
LAB_0012a506:
                  if ((wchar_t *)sVar2 == DAT_0014f528) {
                    if ((wchar_t *)sVar2 != (wchar_t *)0x0) {
                      iVar3 = wmemcmp(local_10b8._M_dataplus._M_p,
                                      Constants::includePathArgumentLong_abi_cxx11_,sVar2);
                      if (iVar3 != 0) goto LAB_0012a52b;
                    }
LAB_0012a558:
                    iVar6 = iVar6 + 1;
                    if (argc <= iVar6) {
                      pPVar5 = (ParamsException *)__cxa_allocate_exception(0x28);
                      local_1090._M_dataplus._M_p = (pointer)&local_1090.field_2;
                      std::__cxx11::wstring::_M_construct<wchar_t_const*>
                                ((wstring *)&local_1090,
                                 L"Key -I (--include) used but without argument",L"");
                      Exception::ParamsException::ParamsException(pPVar5,&local_1090);
                      __cxa_throw(pPVar5,&Exception::ParamsException::typeinfo,
                                  Exception::Exception::~Exception);
                    }
                    mbstowcs((wchar_t *)local_1038,local_1098[iVar6],0x400);
                    std::__cxx11::wstring::operator=(local_1070,(wchar_t *)local_1038);
                  }
                  else {
LAB_0012a52b:
                    if ((wchar_t *)sVar2 == DAT_0014f548) {
                      if ((wchar_t *)sVar2 != (wchar_t *)0x0) {
                        iVar3 = wmemcmp(local_10b8._M_dataplus._M_p,
                                        Constants::includePathArgumentShort_abi_cxx11_,sVar2);
                        if (iVar3 != 0) goto LAB_0012a647;
                      }
                      goto LAB_0012a558;
                    }
                  }
                }
              }
            }
          }
        }
      }
LAB_0012a647:
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)local_10b8._M_dataplus._M_p != &local_10b8.field_2) {
        operator_delete(local_10b8._M_dataplus._M_p,
                        CONCAT44(local_10b8.field_2._M_local_buf[1],
                                 local_10b8.field_2._M_local_buf[0]) * 4 + 4);
      }
      iVar6 = iVar6 + 1;
    } while (iVar6 < argc);
  }
  if (this->m_isHelp != false) {
    pIVar4 = (InformationException *)__cxa_allocate_exception(0x28);
    Exception::InformationException::InformationException
              (pIVar4,(wstring *)Constants::helpText_abi_cxx11_);
    __cxa_throw(pIVar4,&Exception::InformationException::typeinfo,Exception::Exception::~Exception);
  }
  if (this->m_isVersion != true) {
    if ((this->m_sourceFilePath)._M_string_length != 0) {
      return;
    }
    pPVar5 = (ParamsException *)__cxa_allocate_exception(0x28);
    local_1038[0]._M_dataplus._M_p = (pointer)&local_1038[0].field_2;
    std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_1038,L"No source file",L"")
    ;
    Exception::ParamsException::ParamsException(pPVar5,local_1038);
    __cxa_throw(pPVar5,&Exception::ParamsException::typeinfo,Exception::Exception::~Exception);
  }
  pIVar4 = (InformationException *)__cxa_allocate_exception(0x28);
  std::operator+(&local_1058,
                 (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                 Constants::applicationName_abi_cxx11_,L' ');
  std::operator+(&local_1090,&local_1058,
                 (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                 &Constants::applicationVersion_abi_cxx11_);
  std::operator+(&local_10b8,&local_1090,L'\n');
  std::operator+(local_1038,&local_10b8,
                 (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                 Constants::organizationName_abi_cxx11_);
  Exception::InformationException::InformationException(pIVar4,local_1038);
  __cxa_throw(pIVar4,&Exception::InformationException::typeinfo,Exception::Exception::~Exception);
}

Assistant:

void Settings::initParams(int argc, char **argv)
{
    m_isHelp = false;
    m_isVersion = false;
    m_syntaxTraceEnable = false;
    m_advancedEnable = false;
    m_outputFilePath = L"result.s";

    for(int i = 1 ; i < argc; ++i)
    {
        wchar_t buf[PARAM_BUFFER_SIZE + 1];
        std::wstring currentParam;
        mbstowcs(buf, argv[i], PARAM_BUFFER_SIZE);
        currentParam = buf;
        if (currentParam == Constants::helpArgumentLong || currentParam == Constants::helpArgumentShort)
        {
            m_isHelp = true;
        }
        else if (currentParam == Constants::versionArgumentLong || currentParam == Constants::versionArgumentShort)
        {
            m_isVersion = true;
        }
        else if (currentParam == Constants::sourceFilePathArgumentLong || currentParam == Constants::sourceFilePathArgumentShort)
        {
            if (++i < argc)
            {
                mbstowcs(buf, argv[i], PARAM_BUFFER_SIZE);
                m_sourceFilePath = buf;
            }
            else
            {
                throw Exception::ParamsException( L"Key -S (--source) used but without argument" );
            }
        }
        else if (currentParam == Constants::traceArgumentShort || currentParam == Constants::traceArgumentLong)
        {
            m_syntaxTraceEnable = true;
        }
        else if (currentParam == Constants::advancedLogLong || currentParam == Constants::advancedLogShort)
        {
            m_advancedEnable = true;
        }
        else if (currentParam == Constants::outputPathArgumentLong || currentParam == Constants::outputPathArgumentShort)
        {
            if (++i < argc)
            {
                mbstowcs(buf, argv[i], PARAM_BUFFER_SIZE);
                m_outputFilePath = buf;
            }
            else
            {
                throw Exception::ParamsException( L"Key -O (--output) used but without argument" );
            }
        }
        else if (currentParam == Constants::includePathArgumentLong || currentParam == Constants::includePathArgumentShort)
        {
            if (++i < argc)
            {
                mbstowcs(buf, argv[i], PARAM_BUFFER_SIZE);
                m_includeFilePath = buf;
            }
            else
            {
                throw Exception::ParamsException( L"Key -I (--include) used but without argument" );
            }
        }
        else if (currentParam == Constants::logFilePathArgumentLong || currentParam == Constants::logFilePathArgumentShort)
        {

        }
    }
    if (m_isHelp)
    {
        throw Exception::InformationException(Constants::helpText);
    }
    else if (m_isVersion)
    {
        throw Exception::InformationException(Constants::applicationName + L' ' + Constants::applicationVersion + L'\n' + Constants::organizationName);
    }
    else if (m_sourceFilePath.empty())
    {
        throw Exception::ParamsException( L"No source file" );
    }
}